

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

Am_Object move_grow_set_impl_command
                    (Am_Object *inter,Am_Object *object_modified,Am_Inter_Location *data)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Inter_Location *in_RCX;
  Am_Inter_Location local_78;
  Am_Object local_70;
  Am_Inter_Location local_68;
  Am_Inter_Location orig_data;
  Am_Object local_58;
  Am_Object local_50 [3];
  Am_Object local_38;
  undefined1 local_29;
  Am_Inter_Location *data_local;
  Am_Object *object_modified_local;
  Am_Object *inter_local;
  Am_Object *impl_command;
  
  local_29 = 0;
  data_local = data;
  object_modified_local = object_modified;
  inter_local = inter;
  Am_Object::Am_Object(inter);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)object_modified,0xc6);
  Am_Object::operator=(inter,&local_38);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)data);
    Am_Object::Set(inter,0x16d,value,0);
    pAVar2 = Am_Object::Get(object_modified,0xda,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    Am_Object::Set(inter,0xda,bVar1,0);
    Am_Object::Get_Owner(local_50,(Am_Slot_Flags)data);
    bVar1 = Am_Inter_Location::Translate_To(in_RCX,local_50);
    Am_Object::~Am_Object(local_50);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"Can\'t translate data to owner of ");
      poVar3 = operator<<(poVar3,(Am_Object *)data);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Object::Am_Object(&local_58,inter);
    Am_Inter_Location::Am_Inter_Location(&orig_data,in_RCX);
    Am_Copy_Data_Into_Slot(&local_58,0x169,&orig_data);
    Am_Inter_Location::~Am_Inter_Location(&orig_data);
    Am_Object::~Am_Object(&local_58);
    Am_Inter_Location::Am_Inter_Location(&local_68);
    pAVar2 = Am_Object::Get(object_modified,0x16c,0);
    Am_Inter_Location::operator=(&local_68,pAVar2);
    Am_Object::Am_Object(&local_70,inter);
    Am_Inter_Location::Am_Inter_Location(&local_78,&local_68);
    Am_Copy_Data_Into_Slot(&local_70,0x16c,&local_78);
    Am_Inter_Location::~Am_Inter_Location(&local_78);
    Am_Object::~Am_Object(&local_70);
    Am_Inter_Location::~Am_Inter_Location(&local_68);
  }
  return (Am_Object)(Am_Object_Data *)inter;
}

Assistant:

Am_Object
move_grow_set_impl_command(Am_Object inter, Am_Object object_modified,
                           Am_Inter_Location data)
{
  Am_Object impl_command;
  impl_command = inter.Get_Object(Am_IMPLEMENTATION_COMMAND);
  if (impl_command.Valid()) {
    impl_command.Set(Am_OBJECT_MODIFIED, object_modified);
    impl_command.Set(Am_GROWING, (bool)inter.Get(Am_GROWING));

    //adjust the data so it has the right owner
    if (!data.Translate_To(object_modified.Get_Owner()))
      Am_ERROR("Can't translate data to owner of " << object_modified);
    //set current value into the Am_VALUE slot
    Am_Copy_Data_Into_Slot(impl_command, Am_VALUE, data);

    //set original data into the OLD_VALUE slot
    Am_Inter_Location orig_data;
    orig_data = inter.Get(Am_OLD_VALUE);
    Am_Copy_Data_Into_Slot(impl_command, Am_OLD_VALUE, orig_data);
  }
  return impl_command;
}